

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_internal_V2_annotation.cpp
# Opt level: O0

bool __thiscall
ON_OBSOLETE_V5_DimOrdinate::IsValid(ON_OBSOLETE_V5_DimOrdinate *this,ON_TextLog *text_log)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  ON_TextLog *text_log_local;
  ON_OBSOLETE_V5_DimOrdinate *this_local;
  
  if ((this->super_ON_OBSOLETE_V5_Annotation).m_type == dtDimOrdinate) {
    bVar1 = ON_OBSOLETE_V5_Annotation::IsValid(&this->super_ON_OBSOLETE_V5_Annotation,text_log);
    if (bVar1) {
      iVar2 = ON_SimpleArray<ON_2dPoint>::Count
                        (&(this->super_ON_OBSOLETE_V5_Annotation).m_points.
                          super_ON_SimpleArray<ON_2dPoint>);
      if (iVar2 == 2) {
        this_local._7_1_ = true;
      }
      else {
        if (text_log != (ON_TextLog *)0x0) {
          uVar3 = ON_SimpleArray<ON_2dPoint>::Count
                            (&(this->super_ON_OBSOLETE_V5_Annotation).m_points.
                              super_ON_SimpleArray<ON_2dPoint>);
          ON_TextLog::Print(text_log,
                            "ON_OBSOLETE_V5_DimOrdinate - m_points.Count() = %d (should be 2).\n",
                            (ulong)uVar3);
        }
        this_local._7_1_ = false;
      }
    }
    else {
      if (text_log != (ON_TextLog *)0x0) {
        ON_TextLog::Print(text_log,
                          "ON_OBSOLETE_V5_DimOrdinate - invalid ON_OBSOLETE_V5_Annotation base class.\n"
                         );
      }
      this_local._7_1_ = false;
    }
  }
  else {
    if (text_log != (ON_TextLog *)0x0) {
      ON_TextLog::Print(text_log,
                        "ON_OBSOLETE_V5_DimOrdinate - m_type !=  ON_INTERNAL_OBSOLETE::V5_eAnnotationType::dtDimOrdinate.\n"
                       );
    }
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ON_OBSOLETE_V5_DimOrdinate::IsValid( ON_TextLog* text_log) const
{
  if ( m_type != ON_INTERNAL_OBSOLETE::V5_eAnnotationType::dtDimOrdinate)
  {
    if ( text_log )
    {
      text_log->Print("ON_OBSOLETE_V5_DimOrdinate - m_type !=  ON_INTERNAL_OBSOLETE::V5_eAnnotationType::dtDimOrdinate.\n");
    }
    return false;
  }

  if ( !ON_OBSOLETE_V5_Annotation::IsValid( text_log ))
  {
    if ( text_log )
    {
      text_log->Print("ON_OBSOLETE_V5_DimOrdinate - invalid ON_OBSOLETE_V5_Annotation base class.\n");
    }
    return false;
  }

  if ( m_points.Count() != 2 )
  {
    if ( text_log )
    {
      text_log->Print("ON_OBSOLETE_V5_DimOrdinate - m_points.Count() = %d (should be 2).\n",m_points.Count());
    }
    return false;
  }

  return true;

}